

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

void stranspose(double *sig,int rows,int cols,double *col)

{
  double *pdVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (0 < rows) {
    uVar2 = 0;
    uVar3 = 0;
    do {
      if (0 < cols) {
        uVar4 = 0;
        pdVar1 = col;
        do {
          *pdVar1 = sig[uVar2 + uVar4];
          uVar4 = uVar4 + 1;
          pdVar1 = pdVar1 + (uint)rows;
        } while ((uint)cols != uVar4);
      }
      uVar3 = uVar3 + 1;
      col = col + 1;
      uVar2 = (ulong)(uint)((int)uVar2 + cols);
    } while (uVar3 != (uint)rows);
  }
  return;
}

Assistant:

void stranspose(double *sig, int rows, int cols,double *col) {
	int t,u;
	register int i,j;
	#pragma omp parallel for private(i,j,t,u)
	for (i=0; i < rows; i++) {
		t = i * cols;
		u = 0;
		for (j=0; j < cols; j++) {
			col[u+i] = sig[j+t];
			u+=rows;
		}
	}
	
}